

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void lowbd_inv_txfm2d_add_4x16_ssse3
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size_,int eob)

{
  longlong lVar1;
  longlong lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  __m128i *in;
  byte in_CL;
  int in_EDX;
  uint8_t *in_RSI;
  __m128i alVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  __m128i temp [8];
  __m128i buf_32_hi;
  __m128i buf_32_lo;
  __m128i buf_hi;
  __m128i buf_lo;
  int j;
  __m128i ones;
  __m128i scale;
  __m128i *buf_cur;
  int32_t *input_cur;
  int i;
  int row_one_loop;
  int lr_flip;
  int ud_flip;
  transform_1d_ssse3 col_txfm;
  transform_1d_ssse3 row_txfm;
  int txfm_size_row;
  int txfm_size_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  TX_SIZE tx_size;
  __m128i buf [16];
  int in_stack_fffffffffffffc5c;
  undefined6 in_stack_fffffffffffffc60;
  undefined2 in_stack_fffffffffffffc66;
  undefined4 in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  int32_t *in_stack_fffffffffffffc70;
  int local_2cc;
  int local_298;
  int local_290;
  int local_28c;
  transform_1d_ssse3 local_288;
  transform_1d_ssse3 local_280;
  undefined4 local_278;
  undefined4 local_274;
  int local_270;
  int local_26c;
  char *local_268;
  undefined1 local_259;
  longlong local_258 [34];
  byte local_145;
  int local_144;
  uint8_t *local_140;
  undefined2 local_12e;
  undefined4 local_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  longlong lStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  longlong local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined4 local_9c;
  undefined1 local_98 [16];
  undefined4 local_7c;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  undefined2 local_30;
  undefined2 local_2e;
  undefined2 local_2c;
  undefined2 local_2a;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 local_8;
  undefined4 local_4;
  
  local_259 = 0xd;
  local_268 = av1_inv_txfm_shift_ls[0xd];
  local_145 = in_CL;
  local_144 = in_EDX;
  local_140 = in_RSI;
  local_26c = get_txw_idx('\r');
  local_270 = get_txh_idx('\r');
  local_274 = 4;
  local_278 = 0x10;
  local_280 = lowbd_txfm_all_1d_w8_arr[local_26c][""[local_145]];
  local_288 = lowbd_txfm_all_1d_w4_arr[local_270][""[local_145]];
  get_flip_cfg(local_145,&local_28c,&local_290);
  for (local_298 = 0; local_298 < 2; local_298 = local_298 + 1) {
    in = (__m128i *)(local_258 + (long)(local_298 << 3) * 2);
    load_buffer_32bit_to_16bit
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
               (__m128i *)CONCAT26(in_stack_fffffffffffffc66,in_stack_fffffffffffffc60),
               in_stack_fffffffffffffc5c);
    if (local_280 == iidentity4_ssse3) {
      local_12c = 0x180016a1;
      local_4 = 0x180016a1;
      local_8 = 0x180016a1;
      local_c = 0x180016a1;
      local_10 = 0x180016a1;
      local_28 = 0x180016a1180016a1;
      uStack_20 = 0x180016a1180016a1;
      local_12e = 1;
      in_stack_fffffffffffffc66 = 1;
      local_2a = 1;
      local_2c = 1;
      local_2e = 1;
      local_30 = 1;
      local_32 = 1;
      local_34 = 1;
      local_36 = 1;
      local_38 = 1;
      local_48 = 0x1000100010001;
      uStack_40 = 0x1000100010001;
      for (local_2cc = 0; local_2cc < 4; local_2cc = local_2cc + 1) {
        lVar1 = in[local_2cc][0];
        lStack_110 = in[local_2cc][1];
        local_118._0_2_ = (undefined2)lVar1;
        local_118._2_2_ = (undefined2)((ulong)lVar1 >> 0x10);
        local_118._4_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_118._6_2_ = (undefined2)((ulong)lVar1 >> 0x30);
        local_f8 = in[local_2cc][0];
        lVar2 = in[local_2cc][1];
        uStack_f0._0_2_ = (undefined2)lVar2;
        uStack_f0._2_2_ = (undefined2)((ulong)lVar2 >> 0x10);
        uStack_f0._4_2_ = (undefined2)((ulong)lVar2 >> 0x20);
        uStack_f0._6_2_ = (undefined2)((ulong)lVar2 >> 0x30);
        local_b8 = CONCAT26(1,CONCAT24(local_118._2_2_,CONCAT22(1,(undefined2)local_118)));
        uStack_b0 = CONCAT26(1,CONCAT24(local_118._6_2_,CONCAT22(1,local_118._4_2_)));
        auVar4._8_8_ = uStack_b0;
        auVar4._0_8_ = local_b8;
        auVar8._8_8_ = 0x180016a1180016a1;
        auVar8._0_8_ = 0x180016a1180016a1;
        local_78 = pmaddwd(auVar4,auVar8);
        local_7c = 0xd;
        auVar8 = ZEXT416(0xd);
        local_d8 = CONCAT26(1,CONCAT24(uStack_f0._2_2_,CONCAT22(1,(undefined2)uStack_f0)));
        uStack_d0 = CONCAT26(1,CONCAT24(uStack_f0._6_2_,CONCAT22(1,uStack_f0._4_2_)));
        auVar3._8_8_ = uStack_d0;
        auVar3._0_8_ = local_d8;
        auVar9._8_8_ = 0x180016a1180016a1;
        auVar9._0_8_ = 0x180016a1180016a1;
        local_98 = pmaddwd(auVar3,auVar9);
        local_9c = 0xd;
        auVar9 = ZEXT416(0xd);
        local_58 = CONCAT44((int)local_78._4_4_ >> auVar8,(int)local_78._0_4_ >> auVar8);
        uStack_50 = CONCAT44((int)local_78._12_4_ >> auVar8,(int)local_78._8_4_ >> auVar8);
        local_68 = CONCAT44((int)local_98._4_4_ >> auVar9,(int)local_98._0_4_ >> auVar9);
        uStack_60 = CONCAT44((int)local_98._12_4_ >> auVar9,(int)local_98._8_4_ >> auVar9);
        auVar6._8_8_ = uStack_50;
        auVar6._0_8_ = local_58;
        auVar5._8_8_ = uStack_60;
        auVar5._0_8_ = local_68;
        alVar7 = (__m128i)packssdw(auVar6,auVar5);
        in[local_2cc] = alVar7;
        local_128 = local_48;
        uStack_120 = uStack_40;
        local_118 = lVar1;
        local_108 = local_48;
        uStack_100 = uStack_40;
        uStack_f0 = lVar2;
        local_e8 = local_28;
        uStack_e0 = uStack_20;
        local_c8 = local_28;
        uStack_c0 = uStack_20;
      }
    }
    else {
      (*local_280)(in,in);
      round_shift_16bit_ssse3(in,8,(int)*local_268);
    }
    if (local_290 == 0) {
      transpose_16bit_8x4((__m128i *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                          (__m128i *)CONCAT26(in_stack_fffffffffffffc66,in_stack_fffffffffffffc60));
    }
    else {
      flip_buf_sse2(in,(__m128i *)&stack0xfffffffffffffc68,4);
      transpose_16bit_8x4((__m128i *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                          (__m128i *)CONCAT26(in_stack_fffffffffffffc66,in_stack_fffffffffffffc60));
    }
  }
  (*local_288)((__m128i *)local_258,(__m128i *)local_258);
  round_shift_16bit_ssse3((__m128i *)local_258,0x10,(int)local_268[1]);
  lowbd_write_buffer_4xn_sse2((__m128i *)local_258,local_140,local_144,local_28c,0x10);
  return;
}

Assistant:

static void lowbd_inv_txfm2d_add_4x16_ssse3(const int32_t *input,
                                            uint8_t *output, int stride,
                                            TX_TYPE tx_type, TX_SIZE tx_size_,
                                            int eob) {
  (void)tx_size_;
  (void)eob;
  __m128i buf[16];
  const TX_SIZE tx_size = TX_4X16;
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];

  const transform_1d_ssse3 row_txfm =
      lowbd_txfm_all_1d_w8_arr[txw_idx][hitx_1d_tab[tx_type]];
  const transform_1d_ssse3 col_txfm =
      lowbd_txfm_all_1d_w4_arr[txh_idx][vitx_1d_tab[tx_type]];

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  const int row_one_loop = 8;
  for (int i = 0; i < 2; ++i) {
    const int32_t *input_cur = input + i * row_one_loop;
    __m128i *buf_cur = buf + i * row_one_loop;
    load_buffer_32bit_to_16bit(input_cur, txfm_size_row, buf_cur,
                               txfm_size_col);
    if (row_txfm == iidentity4_ssse3) {
      const __m128i scale = pair_set_epi16(NewSqrt2, 3 << (NewSqrt2Bits - 1));
      const __m128i ones = _mm_set1_epi16(1);
      for (int j = 0; j < 4; ++j) {
        const __m128i buf_lo = _mm_unpacklo_epi16(buf_cur[j], ones);
        const __m128i buf_hi = _mm_unpackhi_epi16(buf_cur[j], ones);
        const __m128i buf_32_lo =
            _mm_srai_epi32(_mm_madd_epi16(buf_lo, scale), (NewSqrt2Bits + 1));
        const __m128i buf_32_hi =
            _mm_srai_epi32(_mm_madd_epi16(buf_hi, scale), (NewSqrt2Bits + 1));
        buf_cur[j] = _mm_packs_epi32(buf_32_lo, buf_32_hi);
      }
    } else {
      row_txfm(buf_cur, buf_cur);
      round_shift_16bit_ssse3(buf_cur, row_one_loop, shift[0]);
    }
    if (lr_flip) {
      __m128i temp[8];
      flip_buf_sse2(buf_cur, temp, txfm_size_col);
      transpose_16bit_8x4(temp, buf_cur);
    } else {
      transpose_16bit_8x4(buf_cur, buf_cur);
    }
  }
  col_txfm(buf, buf);
  round_shift_16bit_ssse3(buf, txfm_size_row, shift[1]);
  lowbd_write_buffer_4xn_sse2(buf, output, stride, ud_flip, txfm_size_row);
}